

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walkWindowList(Walker *pWalker,Window *pList,int bOneOnly)

{
  int iVar1;
  
  while( true ) {
    if (pList == (Window *)0x0) {
      return 0;
    }
    iVar1 = sqlite3WalkExprList(pWalker,pList->pOrderBy);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExprList(pWalker,pList->pPartition);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExpr(pWalker,pList->pFilter);
    if (iVar1 != 0) break;
    iVar1 = sqlite3WalkExpr(pWalker,pList->pStart);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExpr(pWalker,pList->pEnd);
    if (iVar1 != 0 || bOneOnly != 0) {
      return (uint)(iVar1 != 0) * 2;
    }
    pList = pList->pNextWin;
  }
  return 2;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList, int bOneOnly){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    int rc;
    rc = sqlite3WalkExprList(pWalker, pWin->pOrderBy);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExprList(pWalker, pWin->pPartition);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pFilter);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pStart);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pEnd);
    if( rc ) return WRC_Abort;
    if( bOneOnly ) break;
  }
  return WRC_Continue;
}